

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dht_tracker.cpp
# Opt level: O0

void __thiscall
libtorrent::dht::dht_tracker::update_node_id(dht_tracker *this,listen_socket_handle *s)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_28;
  _Self local_20;
  iterator n;
  listen_socket_handle *s_local;
  dht_tracker *this_local;
  
  n._M_node = (_Base_ptr)s;
  local_20._M_node =
       (_Base_ptr)
       ::std::
       map<libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node,_std::less<libtorrent::aux::listen_socket_handle>,_std::allocator<std::pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node>_>_>
       ::find(&this->m_nodes,s);
  local_28._M_node =
       (_Base_ptr)
       ::std::
       map<libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node,_std::less<libtorrent::aux::listen_socket_handle>,_std::allocator<std::pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node>_>_>
       ::end(&this->m_nodes);
  bVar1 = ::std::operator!=(&local_20,&local_28);
  if (bVar1) {
    ppVar2 = ::std::
             _Rb_tree_iterator<std::pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node>_>
             ::operator->(&local_20);
    dht::node::update_node_id(&(ppVar2->second).dht);
  }
  update_storage_node_ids(this);
  return;
}

Assistant:

void dht_tracker::update_node_id(aux::listen_socket_handle const& s)
	{
		auto n = m_nodes.find(s);
		if (n != m_nodes.end())
			n->second.dht.update_node_id();
		update_storage_node_ids();
	}